

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitLir.c
# Opt level: O0

void set_emit_enter(sljit_compiler *compiler,sljit_s32 options,sljit_s32 args,sljit_s32 scratches,
                   sljit_s32 saveds,sljit_s32 fscratches,sljit_s32 fsaveds,sljit_s32 param_8)

{
  sljit_s32 fscratches_local;
  sljit_s32 saveds_local;
  sljit_s32 scratches_local;
  sljit_s32 args_local;
  sljit_s32 options_local;
  sljit_compiler *compiler_local;
  
  compiler->options = options;
  compiler->scratches = scratches;
  compiler->saveds = saveds;
  compiler->fscratches = fscratches;
  compiler->fsaveds = fsaveds;
  return;
}

Assistant:

static SLJIT_INLINE void set_emit_enter(struct sljit_compiler *compiler,
	sljit_s32 options, sljit_s32 args, sljit_s32 scratches, sljit_s32 saveds,
	sljit_s32 fscratches, sljit_s32 fsaveds, sljit_s32 local_size)
{
	SLJIT_UNUSED_ARG(args);
	SLJIT_UNUSED_ARG(local_size);

	compiler->options = options;
	compiler->scratches = scratches;
	compiler->saveds = saveds;
	compiler->fscratches = fscratches;
	compiler->fsaveds = fsaveds;
#if (defined SLJIT_ARGUMENT_CHECKS && SLJIT_ARGUMENT_CHECKS)
	compiler->logical_local_size = local_size;
#endif
}